

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerBrCMem
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isHelper)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BranchInstr *pBVar5;
  Opnd *pOVar6;
  HelperCallOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar7;
  BailOutInfo *pBVar8;
  OpCode OVar9;
  JnHelperMethod fnHelper;
  bool local_31 [8];
  bool isHelper_local;
  
  pIVar1 = instr->m_prev;
  local_31[0] = isHelper;
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x29e4,"(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr)",
                       "Expected 2 src opnds on BrC");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (!noMathFastPath) {
    pBVar5 = IR::Instr::AsBranchInstr(instr);
    bVar3 = GenerateFastCondBranch(this,pBVar5,local_31);
    if (!bVar3) {
      return pIVar1;
    }
  }
  if (helperMethod == HelperOp_NotEqual) {
    fnHelper = HelperOp_Equal;
LAB_0055a077:
    pBVar5 = IR::Instr::AsBranchInstr(instr);
    IR::BranchInstr::Invert(pBVar5);
    OVar9 = ExtendedOpcodePrefix;
  }
  else {
    if (helperMethod == HelperOp_NotStrictEqual) {
      fnHelper = HelperOp_StrictEqual;
      goto LAB_0055a077;
    }
    OVar9 = EndOfBlock;
    fnHelper = helperMethod;
    if (0xfffffffd < helperMethod - HelperOp_NotStrictEqual) goto LAB_0055a09a;
  }
  LoadScriptContext(this,instr);
LAB_0055a09a:
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  if (helperMethod != HelperOp_StrictEqualEmptyString) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar6);
  }
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar6);
  src1Opnd = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  pIVar7 = IR::Instr::New(Call,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  pIVar7 = LowererMD::LowerCall(&this->m_lowererMD,pIVar7,0);
  if (instr->m_opcode - 0x198 < 4) {
    OVar9 = ExtendedOpcodePrefix;
  }
  else if ((instr->m_opcode - 0x194 < 4) && ((instr->field_0x38 & 0x10) != 0)) {
    pBVar8 = IR::Instr::GetBailOutInfo(instr);
    pBVar8->isInvertedBranch = true;
  }
  IR::Instr::SetSrc1(instr,&dstOpnd->super_Opnd);
  instr->m_opcode = OVar9 ^ BrTrue_A;
  pBVar5 = IR::Instr::AsBranchInstr(instr);
  LowerCondBranchCheckBailOut(this,pBVar5,pIVar7,(bool)(!noMathFastPath & local_31[0]));
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBrCMem(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndSrc;
    IR::Opnd  * opndDst;
    StackSym * symDst;
    bool inverted = false;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() != nullptr, "Expected 2 src opnds on BrC");

    if (!noMathFastPath && !this->GenerateFastCondBranch(instr->AsBranchInstr(), &isHelper))
    {
        return instrPrev;
    }

    // Push the args in reverse order.
    const bool loadScriptContext = !(helperMethod == IR::HelperOp_StrictEqualString || helperMethod == IR::HelperOp_StrictEqualEmptyString);
    const bool loadArg2 = !(helperMethod == IR::HelperOp_StrictEqualEmptyString);

    if (helperMethod == IR::HelperOp_NotEqual)
    {
        // Op_NotEqual() returns !Op_Equal().  It is faster to call Op_Equal() directly.
        helperMethod = IR::HelperOp_Equal;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }
    else if(helperMethod == IR::HelperOp_NotStrictEqual)
    {
        // Op_NotStrictEqual() returns !Op_StrictEqual().  It is faster to call Op_StrictEqual() directly.
        helperMethod = IR::HelperOp_StrictEqual;
        instr->AsBranchInstr()->Invert();
        inverted = true;
    }

    if (loadScriptContext)
        LoadScriptContext(instr);

    opndSrc = instr->UnlinkSrc2();
    if (loadArg2)
        m_lowererMD.LoadHelperArgument(instr, opndSrc);

    opndSrc = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, opndSrc);

    // Generate helper call to compare the source operands.

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);
    symDst = StackSym::New(TyMachReg, this->m_func);
    opndDst = IR::RegOpnd::New(symDst, TyMachReg, this->m_func);
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (instr->HasBailOutInfo())
        {
            instr->GetBailOutInfo()->isInvertedBranch = true;
        }
        break;

    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotLe_A:
    case Js::OpCode::BrNotLt_A:
        inverted = true;
        break;
    }

    // Branch if the result is "true".

    instr->SetSrc1(opndDst);
    instr->m_opcode = (inverted ? Js::OpCode::BrFalse_A : Js::OpCode::BrTrue_A);
    this->LowerCondBranchCheckBailOut(instr->AsBranchInstr(), instrCall, !noMathFastPath && isHelper);

    return instrPrev;
}